

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_get_auxdata(sqlite3_context *pCtx,int iArg)

{
  void *local_28;
  AuxData *local_20;
  AuxData *pAuxData;
  int iArg_local;
  sqlite3_context *pCtx_local;
  
  for (local_20 = pCtx->pVdbe->pAuxData;
      (local_20 != (AuxData *)0x0 && ((local_20->iOp != pCtx->iOp || (local_20->iArg != iArg))));
      local_20 = local_20->pNext) {
  }
  if (local_20 == (AuxData *)0x0) {
    local_28 = (void *)0x0;
  }
  else {
    local_28 = local_20->pAux;
  }
  return local_28;
}

Assistant:

SQLITE_API void *sqlite3_get_auxdata(sqlite3_context *pCtx, int iArg){
  AuxData *pAuxData;

  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
#if SQLITE_ENABLE_STAT3_OR_STAT4
  if( pCtx->pVdbe==0 ) return 0;
#else
  assert( pCtx->pVdbe!=0 );
#endif
  for(pAuxData=pCtx->pVdbe->pAuxData; pAuxData; pAuxData=pAuxData->pNext){
    if( pAuxData->iOp==pCtx->iOp && pAuxData->iArg==iArg ) break;
  }

  return (pAuxData ? pAuxData->pAux : 0);
}